

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

string * verona::unquote(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  const_reference pvVar2;
  string *s_local;
  
  sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(s)
  ;
  if ((1 < sVar1) &&
     (pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,0
                           ), *pvVar2 == '\"')) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (s);
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                        sVar1 - 1);
    if (*pvVar2 == '\"') {
      sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(s);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,1,sVar1 - 2)
      ;
      return __return_storage_ptr__;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(const std::string& s)
  {
    return ((s.size() >= 2) && (s[0] == '"') && (s[s.size() - 1] == '"')) ?
      s.substr(1, s.size() - 2) :
      s;
  }